

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O2

void __thiscall xmrig::OclBackend::start(OclBackend *this,IWorker *worker,bool ready)

{
  bool bVar1;
  
  std::mutex::lock((mutex *)mutex);
  bVar1 = OclLaunchStatus::started(&this->d_ptr->status,ready);
  if (bVar1) {
    OclLaunchStatus::print(&this->d_ptr->status);
    LOCK();
    OclWorker::ready = 1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  if (ready) {
    (*worker->_vptr_IWorker[8])(worker);
    return;
  }
  return;
}

Assistant:

void xmrig::OclBackend::start(IWorker *worker, bool ready)
{
    mutex.lock();

    if (d_ptr->status.started(ready)) {
        d_ptr->status.print();

        OclWorker::ready = true;
    }

    mutex.unlock();

    if (ready) {
        worker->start();
    }
}